

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O1

SinkNextBatchType __thiscall
duckdb::PhysicalPartitionedAggregate::NextBatch
          (PhysicalPartitionedAggregate *this,ExecutionContext *context,
          OperatorSinkNextBatchInput *input)

{
  PartitionedAggregateGlobalSinkState::Combine
            ((PartitionedAggregateGlobalSinkState *)input->global_state,context->client,
             (PartitionedAggregateLocalSinkState *)input->local_state);
  return READY;
}

Assistant:

SinkNextBatchType PhysicalPartitionedAggregate::NextBatch(ExecutionContext &context,
                                                          OperatorSinkNextBatchInput &input) const {
	// flush the local state
	auto &gstate = input.global_state.Cast<PartitionedAggregateGlobalSinkState>();
	auto &lstate = input.local_state.Cast<PartitionedAggregateLocalSinkState>();

	// finalize and reset the current state (if any)
	gstate.Combine(context.client, lstate);
	return SinkNextBatchType::READY;
}